

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::LocalsWalker::GetGroupObject
          (LocalsWalker *this,UIGroupType uiGroupType,int i,ResolvedObject *pResolvedObject)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Type *ppVVar4;
  int iVar5;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int iVar6;
  BOOL local_34;
  
  if (this->pVarWalkers !=
      (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = this->pVarWalkers;
    iVar5 = (this_00->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    bVar2 = 0 < iVar5;
    if (0 < iVar5) {
      iVar5 = 0;
      iVar6 = 0;
      do {
        ppVVar4 = JsUtil::
                  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,iVar5);
        bVar3 = true;
        if (((*ppVVar4)->groupType == uiGroupType) && (iVar6 = iVar6 + 1, i < iVar6)) {
          local_34 = VariableWalkerBase::GetGroupObject(*ppVVar4,pResolvedObject);
          bVar3 = false;
        }
        if (!bVar3) break;
        iVar5 = iVar5 + 1;
        this_00 = this->pVarWalkers;
        iVar1 = (this_00->
                super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        bVar2 = iVar5 < iVar1;
      } while (iVar5 < iVar1);
    }
    if (bVar2) {
      return local_34;
    }
  }
  return 0;
}

Assistant:

BOOL LocalsWalker::GetGroupObject(Js::UIGroupType uiGroupType, int i, ResolvedObject* pResolvedObject)
    {
        if (pVarWalkers)
        {
            int scopeCount = 0;
            for (int j = 0; j < pVarWalkers->Count(); j++)
            {
                VariableWalkerBase* variableWalker = pVarWalkers->Item(j);

                if (variableWalker->groupType == uiGroupType)
                {
                    scopeCount++;
                    if (i < scopeCount)
                    {
                        return variableWalker->GetGroupObject(pResolvedObject);
                    }
                }
            }
        }
        return FALSE;
    }